

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int little2_sameName(ENCODING *enc,char *ptr1,char *ptr2)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  
  do {
    bVar1 = ((byte *)ptr1)[1];
    if (bVar1 < 0xdc) {
      bVar2 = 7;
      if (3 < bVar1 - 0xd8) {
        if (bVar1 == 0) {
          bVar2 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr1);
        }
        else {
LAB_004e2465:
          bVar2 = 0x1d;
        }
      }
    }
    else if (bVar1 - 0xdc < 4) {
      bVar2 = 8;
    }
    else {
      if ((bVar1 != 0xff) || ((byte)*ptr1 < 0xfe)) goto LAB_004e2465;
      bVar2 = 0;
    }
    if (bVar2 < 0x1e) {
      uVar3 = (uint)bVar2;
      if ((0x2f400000U >> (uVar3 & 0x1f) & 1) == 0) {
        if (uVar3 != 6) {
          if (uVar3 != 7) goto LAB_004e24b8;
          if (*ptr1 != *ptr2) {
            return 0;
          }
          ptr1 = (char *)((byte *)ptr1 + 1);
          ptr2 = (char *)((byte *)ptr2 + 1);
        }
        if (*ptr1 != *ptr2) {
          return 0;
        }
        ptr1 = (char *)((byte *)ptr1 + 1);
        ptr2 = (char *)((byte *)ptr2 + 1);
        goto LAB_004e24bd;
      }
      if (*ptr2 != *ptr1) {
        return 0;
      }
      if (((byte *)ptr2)[1] != bVar1) {
        return 0;
      }
    }
    else {
LAB_004e24b8:
      if (bVar2 != 5) {
        bVar1 = ((byte *)ptr2)[1];
        if (bVar1 < 0xdc) {
          bVar2 = 7;
          if (bVar1 - 0xd8 < 4) goto LAB_004e2529;
          if (bVar1 == 0) {
            bVar2 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr2);
            goto LAB_004e2529;
          }
        }
        else {
          if (bVar1 - 0xdc < 4) {
            bVar2 = 8;
            goto LAB_004e2529;
          }
          if ((bVar1 == 0xff) && (0xfd < (byte)*ptr2)) {
            bVar2 = 0;
            goto LAB_004e2529;
          }
        }
        bVar2 = 0x1d;
LAB_004e2529:
        if ((bVar2 < 0x1e) && ((0x2f4000e0U >> (bVar2 & 0x1f) & 1) != 0)) {
          return 0;
        }
        return 1;
      }
LAB_004e24bd:
      if (*ptr1 != *ptr2) {
        return 0;
      }
      if (((byte *)ptr1)[1] != ((byte *)ptr2)[1]) {
        return 0;
      }
    }
    ptr2 = (char *)((byte *)ptr2 + 2);
    ptr1 = (char *)((byte *)ptr1 + 2);
  } while( true );
}

Assistant:

static int PTRCALL
PREFIX(sameName)(const ENCODING *enc, const char *ptr1, const char *ptr2)
{
  for (;;) {
    switch (BYTE_TYPE(enc, ptr1)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: \
      if (*ptr1++ != *ptr2++) \
        return 0;
    LEAD_CASE(4) LEAD_CASE(3) LEAD_CASE(2)
#undef LEAD_CASE
      /* fall through */
      if (*ptr1++ != *ptr2++)
        return 0;
      break;
    case BT_NONASCII:
    case BT_NMSTRT:
#ifdef XML_NS
    case BT_COLON:
#endif
    case BT_HEX:
    case BT_DIGIT:
    case BT_NAME:
    case BT_MINUS:
      if (*ptr2++ != *ptr1++)
        return 0;
      if (MINBPC(enc) > 1) {
        if (*ptr2++ != *ptr1++)
          return 0;
        if (MINBPC(enc) > 2) {
          if (*ptr2++ != *ptr1++)
            return 0;
          if (MINBPC(enc) > 3) {
            if (*ptr2++ != *ptr1++)
              return 0;
          }
        }
      }
      break;
    default:
      if (MINBPC(enc) == 1 && *ptr1 == *ptr2)
        return 1;
      switch (BYTE_TYPE(enc, ptr2)) {
      case BT_LEAD2:
      case BT_LEAD3:
      case BT_LEAD4:
      case BT_NONASCII:
      case BT_NMSTRT:
#ifdef XML_NS
      case BT_COLON:
#endif
      case BT_HEX:
      case BT_DIGIT:
      case BT_NAME:
      case BT_MINUS:
        return 0;
      default:
        return 1;
      }
    }
  }
  /* not reached */
}